

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobReader.cpp
# Opt level: O3

uint __thiscall
dai::anon_unknown_3::readFromBlob<unsigned_int>
          (anon_unknown_3 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *blob,
          uint32_t *offset)

{
  uint uVar1;
  length_error *this_00;
  
  uVar1 = *offset;
  if ((ulong)uVar1 + 4 <= (ulong)((long)blob - (long)this)) {
    *offset = uVar1 + 4;
    return *(uint *)(this + uVar1);
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  ::std::length_error::length_error
            (this_00,"BlobReader error: Filesize is less than blob specifies. Likely corrupted");
  __cxa_throw(this_00,&::std::length_error::typeinfo,::std::length_error::~length_error);
}

Assistant:

T readFromBlob(const std::vector<std::uint8_t>& blob, uint32_t& offset) {
    if(offset + sizeof(T) > blob.size()) {
        throw std::length_error("BlobReader error: Filesize is less than blob specifies. Likely corrupted");
    }

    auto srcPtr = blob.data() + offset;
    offset += sizeof(T);

    return *reinterpret_cast<const T*>(srcPtr);
}